

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O0

void __thiscall
absl::lts_20250127::Cord::InlineRep::EmplaceTree
          (InlineRep *this,Nonnull<CordRep_*> rep,MethodIdentifier method)

{
  int64_t sampling_stride;
  MethodIdentifier method_local;
  Nonnull<CordRep_*> rep_local;
  InlineRep *this_local;
  int64_t stride;
  
  if (rep != (Nonnull<CordRep_*>)0x0) {
    cord_internal::InlineData::make_tree(&this->data_,rep);
    sampling_stride = cord_internal::cordz_should_profile();
    if (0 < sampling_stride) {
      cord_internal::CordzInfo::TrackCord(&this->data_,method,sampling_stride);
    }
    return;
  }
  __assert_fail("rep",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.h"
                ,0x4e8,
                "void absl::Cord::InlineRep::EmplaceTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
               );
}

Assistant:

inline void Cord::InlineRep::EmplaceTree(absl::Nonnull<CordRep*> rep,
                                         MethodIdentifier method) {
  assert(rep);
  data_.make_tree(rep);
  CordzInfo::MaybeTrackCord(data_, method);
}